

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O0

int jpc_dec_cp_setfromqcc(jpc_dec_cp_t *cp,jpc_qcc_t *qcc)

{
  int iVar1;
  jpc_qcc_t *qcc_local;
  jpc_dec_cp_t *cp_local;
  
  iVar1 = jpc_dec_cp_setfromqcx(cp,cp->ccps + qcc->compno,&qcc->compparms,8);
  return iVar1;
}

Assistant:

static int jpc_dec_cp_setfromqcc(jpc_dec_cp_t *cp, jpc_qcc_t *qcc)
{
	return jpc_dec_cp_setfromqcx(cp, &cp->ccps[qcc->compno], &qcc->compparms, JPC_QCC);
}